

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afmparse.c
# Opt level: O2

int afm_compare_kern_pairs(void *a,void *b)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  AFM_KernPair kp2;
  
  uVar2 = (ulong)*(uint *)((long)a + 4) | (ulong)*a << 0x10;
  uVar3 = (ulong)*(uint *)((long)b + 4) | (ulong)*b << 0x10;
  iVar1 = 1;
  if (uVar2 <= uVar3) {
    iVar1 = -(uint)(uVar2 < uVar3);
  }
  return iVar1;
}

Assistant:

FT_CALLBACK_DEF( int )
  afm_compare_kern_pairs( const void*  a,
                          const void*  b )
  {
    AFM_KernPair  kp1 = (AFM_KernPair)a;
    AFM_KernPair  kp2 = (AFM_KernPair)b;

    FT_ULong  index1 = KERN_INDEX( kp1->index1, kp1->index2 );
    FT_ULong  index2 = KERN_INDEX( kp2->index1, kp2->index2 );


    if ( index1 > index2 )
      return 1;
    else if ( index1 < index2 )
      return -1;
    else
      return 0;
  }